

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomData.hpp
# Opt level: O2

void __thiscall OpenMD::AtomData::~AtomData(AtomData *this)

{
  (this->super_GenericData)._vptr_GenericData = (_func_int **)&PTR__AtomData_002831e0;
  std::
  vector<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>::
  ~vector(&this->data);
  GenericData::~GenericData(&this->super_GenericData);
  return;
}

Assistant:

AtomData(const std::string& id = "ATOMDATA") : GenericData(id) {}